

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

json_string * __thiscall
JSONWorker::toUTF8_abi_cxx11_(json_string *__return_storage_ptr__,JSONWorker *this,uchar p)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\\u",&local_11);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::toUTF8(json_uchar p) json_nothrow {
	   #ifdef JSON_UNICODE
		  if (json_unlikely(p > 0xFFFF)) return toSurrogatePair(p);
	   #endif
	   json_string res(JSON_TEXT("\\u"));
	   #ifdef JSON_UNICODE
		  START_MEM_SCOPE
			 json_uchar hihi = ((p & 0xF000) >> 12) + 48;
			 if (hihi > 57) hihi += 7; //A-F don't immediately follow 0-9, so have to further adjust those
			 json_uchar hilo = ((p & 0x0F00) >> 8) + 48;
			 if (hilo > 57) hilo += 7; //A-F don't immediately follow 0-9, so have to further adjust those
			 res += hihi;
			 res += hilo;
		  END_MEM_SCOPE
		  json_uchar hi = ((p & 0x00F0) >> 4) + 48;
	   #else
		  res += JSON_TEXT("00");
		  json_uchar hi = (p >> 4) + 48;
	   #endif
	   //convert the character to be escaped into two digits between 0 and 15
	   if (hi > 57) hi += 7; //A-F don't immediately follow 0-9, so have to further adjust those
	   json_uchar lo = (p & 0x000F) + 48;
	   if (lo > 57) lo += 7; //A-F don't immediately follow 0-9, so have to further adjust those
	   res += hi;
	   res += lo;
	   return res;
    }